

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O0

REF_STATUS ref_cloud_push(REF_CLOUD ref_cloud,REF_GLOB global,REF_DBL *aux)

{
  int iVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  int local_30;
  REF_INT i;
  REF_INT item;
  REF_DBL *aux_local;
  REF_GLOB global_local;
  REF_CLOUD ref_cloud_local;
  
  if (ref_cloud->max == ref_cloud->n) {
    ref_cloud->max = ref_cloud->max + 100;
    fflush(_stdout);
    if (0 < ref_cloud->max) {
      pRVar2 = (REF_GLOB *)realloc(ref_cloud->global,(long)ref_cloud->max << 3);
      ref_cloud->global = pRVar2;
    }
    if (ref_cloud->global == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x85,
             "ref_cloud_push","realloc ref_cloud->global NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_cloud->max,
             (long)ref_cloud->max,8,(long)ref_cloud->max << 3);
      return 2;
    }
    fflush(_stdout);
    if (0 < ref_cloud->naux * ref_cloud->max) {
      pRVar3 = (REF_DBL *)realloc(ref_cloud->aux,(long)(ref_cloud->naux * ref_cloud->max) << 3);
      ref_cloud->aux = pRVar3;
    }
    if (ref_cloud->aux == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x87,
             "ref_cloud_push","realloc ref_cloud->aux NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
             (ulong)(uint)(ref_cloud->naux * ref_cloud->max),
             (long)(ref_cloud->naux * ref_cloud->max),8,
             (long)(ref_cloud->naux * ref_cloud->max) << 3);
      return 2;
    }
  }
  iVar1 = ref_cloud->n;
  ref_cloud->n = ref_cloud->n + 1;
  ref_cloud->global[iVar1] = global;
  for (local_30 = 0; local_30 < ref_cloud->naux; local_30 = local_30 + 1) {
    ref_cloud->aux[local_30 + ref_cloud->naux * iVar1] = aux[local_30];
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_push(REF_CLOUD ref_cloud, REF_GLOB global,
                                  REF_DBL *aux) {
  REF_INT item, i;

  if (ref_cloud_max(ref_cloud) == ref_cloud_n(ref_cloud)) {
    ref_cloud_max(ref_cloud) += 100;

    ref_realloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
    ref_realloc(ref_cloud->aux,
                ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);
  }

  /* fill */
  item = ref_cloud_n(ref_cloud);
  ref_cloud_n(ref_cloud)++;
  ref_cloud_global(ref_cloud, item) = global;
  each_ref_cloud_aux(ref_cloud, i) {
    ref_cloud_aux(ref_cloud, i, item) = aux[i];
  }

  return REF_SUCCESS;
}